

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createOpConstantCompositeTests(TestContext *testCtx)

{
  mapped_type *pmVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  NameConstantsCode *name;
  byte bVar10;
  key_type local_3a0;
  TestCaseGroup *local_380;
  vector<int,_std::allocator<int>_> local_378;
  long lStack_360;
  key_type local_350;
  long *local_330 [2];
  long local_320 [2];
  long local_310;
  RGBA outputColors [4];
  RGBA inputColors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  NameConstantsCode tests [5];
  char functionEnd [48];
  char functionStart [108];
  
  bVar10 = 0;
  local_380 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (local_380,testCtx,"opconstantcomposite","OpConstantComposite instruction");
  inputColors[0].m_value = 0;
  inputColors[1].m_value = 0;
  inputColors[2].m_value = 0;
  inputColors[3].m_value = 0;
  outputColors[0].m_value = 0;
  outputColors[1].m_value = 0;
  outputColors[2].m_value = 0;
  outputColors[3].m_value = 0;
  pcVar7 = 
  "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1 = OpFunctionParameter %v4f32\n%lbl    = OpLabel\n"
  ;
  pcVar8 = functionStart;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
    pcVar7 = pcVar7 + ((ulong)bVar10 * -2 + 1) * 8;
    pcVar8 = pcVar8 + (ulong)bVar10 * -0x10 + 8;
  }
  builtin_strncpy(functionStart + 0x68,"el\n",4);
  tests[0].name._M_dataplus._M_p = (pointer)&tests[0].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)tests,"vec4","");
  tests[0].constants._M_dataplus._M_p = (pointer)&tests[0].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[0].constants,
             "%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n"
             ,"");
  tests[0].code._M_dataplus._M_p = (pointer)&tests[0].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[0].code,"%transformed_param = OpFAdd %v4f32 %param1 %cval\n","");
  tests[1].name._M_dataplus._M_p = (pointer)&tests[1].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 1),"struct","");
  tests[1].constants._M_dataplus._M_p = (pointer)&tests[1].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[1].constants,
             "%stype             = OpTypeStruct %v4f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n%f32_n_1           = OpConstant %f32 -1.0\n%f32_1_5           = OpConstant %f32 !0x3fc00000\n%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n%cval              = OpConstantComposite %stype %cvec %f32_n_1\n"
             ,"");
  tests[1].code._M_dataplus._M_p = (pointer)&tests[1].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[1].code,
             "%v                 = OpVariable %fp_stype Function %cval\n%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n%vec_val           = OpLoad %v4f32 %vec_ptr\n%f32_val           = OpLoad %f32 %f32_ptr\n%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n"
             ,"");
  tests[2].name._M_dataplus._M_p = (pointer)&tests[2].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 2),"matrix","");
  tests[2].constants._M_dataplus._M_p = (pointer)&tests[2].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[2].constants,
             "%mat4x4_f32          = OpTypeMatrix %v4f32 4\n%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n"
             ,"");
  tests[2].code._M_dataplus._M_p = (pointer)&tests[2].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[2].code,
             "%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n","");
  tests[3].name._M_dataplus._M_p = (pointer)&tests[3].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 3),"array","");
  name = tests;
  tests[3].constants._M_dataplus._M_p = (pointer)&tests[3].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].constants,
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%f32_n_1             = OpConstant %f32 -1.0\n%f32_1_5             = OpConstant %f32 !0x3fc00000\n%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n"
             ,"");
  tests[3].code._M_dataplus._M_p = (pointer)&tests[3].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].code,
             "%v                   = OpVariable %fp_a4f32 Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n%f_val               = OpLoad %f32 %f\n%f1_val              = OpLoad %f32 %f1\n%f2_val              = OpLoad %f32 %f2\n%f3_val              = OpLoad %f32 %f3\n%ftot1               = OpFAdd %f32 %f_val %f1_val\n%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,"");
  tests[4].name._M_dataplus._M_p = (pointer)&tests[4].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(tests + 4),"array_of_struct_of_array","");
  tests[4].constants._M_dataplus._M_p = (pointer)&tests[4].constants.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].constants,
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%stype               = OpTypeStruct %f32 %a4f32\n%a3stype             = OpTypeArray %stype %c_u32_3\n%fp_a3stype          = OpTypePointer Function %a3stype\n%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1"
             ,"");
  paVar9 = &tests[4].code.field_2;
  tests[4].code._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].code,
             "%v                   = OpVariable %fp_a3stype Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n%f_l                 = OpLoad %f32 %f\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,"");
  getHalfColorsFullAlpha(&inputColors);
  outputColors[0].m_value = 0xffffffff;
  outputColors[1].m_value = 0xff7f7fff;
  outputColors[2].m_value = 0xff7fff7f;
  outputColors[3].m_value = 0xffff7f7f;
  lVar4 = 5;
  do {
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_310 = lVar4;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"pre_main","");
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_3a0);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    local_330[0] = local_320;
    sVar2 = strlen(functionStart);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_330,functionStart,functionStart + sVar2);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_330,(ulong)(name->code)._M_dataplus._M_p);
    local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    plVar5 = plVar3 + 2;
    if ((pointer *)*plVar3 == (pointer *)plVar5) {
      local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar5;
      lStack_360 = plVar3[3];
    }
    else {
      local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*plVar5;
      local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar3;
    }
    local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_378);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_3a0.field_2._M_allocated_capacity = *puVar6;
      local_3a0.field_2._8_4_ = (undefined4)plVar3[3];
      local_3a0.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    }
    else {
      local_3a0.field_2._M_allocated_capacity = *puVar6;
      local_3a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_3a0._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"testfun","");
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_350);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_330[0] != local_320) {
      operator_delete(local_330[0],local_320[0] + 1);
    }
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_allocated_capacity =
         local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    createTestsForAllStages
              (&name->name,&inputColors,&outputColors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments._M_t,&local_378,local_380,QP_TEST_RESULT_FAIL,&local_3a0);
    if (local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar4 = local_310;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    name = name + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = -0x1e0;
  do {
    plVar3 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
    if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
      operator_delete(plVar3,paVar9->_M_allocated_capacity + 1);
    }
    if (paVar9 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar9[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar9[-3]._M_allocated_capacity,paVar9[-2]._M_allocated_capacity + 1)
      ;
    }
    if (paVar9 + -4 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar9[-5]._M_allocated_capacity) {
      operator_delete((long *)paVar9[-5]._M_allocated_capacity,paVar9[-4]._M_allocated_capacity + 1)
      ;
    }
    paVar9 = paVar9 + -6;
    lVar4 = lVar4 + 0x60;
  } while (lVar4 != 0);
  return local_380;
}

Assistant:

tcu::TestCaseGroup* createOpConstantCompositeTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantCompositeTests		(new tcu::TestCaseGroup(testCtx, "opconstantcomposite", "OpConstantComposite instruction"));
	RGBA							inputColors[4];
	RGBA							outputColors[4];


	const char						functionStart[]	 =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]		=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",

			"%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cval\n"
		},
		{
			"struct",

			"%stype             = OpTypeStruct %v4f32 %f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%f32_n_1           = OpConstant %f32 -1.0\n"
			"%f32_1_5           = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n"
			"%cval              = OpConstantComposite %stype %cvec %f32_n_1\n",

			"%v                 = OpVariable %fp_stype Function %cval\n"
			"%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%vec_val           = OpLoad %v4f32 %vec_ptr\n"
			"%f32_val           = OpLoad %f32 %f32_ptr\n"
			"%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n" // vec4(-1)
			"%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n" // param1 + vec4(-1)
			"%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n" // param1 + vec4(-1) + vec4(1.5, 1.5, 1.5, 1.0)
		},
		{
			// [1|0|0|0.5] [x] = x + 0.5
			// [0|1|0|0.5] [y] = y + 0.5
			// [0|0|1|0.5] [z] = z + 0.5
			// [0|0|0|1  ] [1] = 1
			"matrix",

			"%mat4x4_f32          = OpTypeMatrix %v4f32 4\n"
		    "%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n"
		    "%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n"
			"%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n",

			"%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n"
		},
		{
			"array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%f32_n_1             = OpConstant %f32 -1.0\n"
			"%f32_1_5             = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n",

			"%v                   = OpVariable %fp_a4f32 Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n"
			"%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n"
			"%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n"
			"%f_val               = OpLoad %f32 %f\n"
			"%f1_val              = OpLoad %f32 %f1\n"
			"%f2_val              = OpLoad %f32 %f2\n"
			"%f3_val              = OpLoad %f32 %f3\n"
			"%ftot1               = OpFAdd %f32 %f_val %f1_val\n"
			"%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n"
			"%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n"  // 0 - 1 + 1.5 + 0
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		},
		{
			//
			// [
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   },
			//   {
			//      1.0,
			//      [ 0.0, 0.5, 0.0, 0.0]
			//   }, //     ^^^
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   }
			// ]
			"array_of_struct_of_array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%stype               = OpTypeStruct %f32 %a4f32\n"
			"%a3stype             = OpTypeArray %stype %c_u32_3\n"
			"%fp_a3stype          = OpTypePointer Function %a3stype\n"
			"%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n"
			"%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n"
			"%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n"
			"%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n"
			"%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1",

			"%v                   = OpVariable %fp_a3stype Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n"
			"%f_l                 = OpLoad %f32 %f\n"
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		}
	};

	getHalfColorsFullAlpha(inputColors);
	outputColors[0] = RGBA(255, 255, 255, 255);
	outputColors[1] = RGBA(255, 127, 127, 255);
	outputColors[2] = RGBA(127, 255, 127, 255);
	outputColors[3] = RGBA(127, 127, 255, 255);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, inputColors, outputColors, fragments, opConstantCompositeTests.get());
	}
	return opConstantCompositeTests.release();
}